

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.c
# Opt level: O0

void DrawRectangleLinesEx(Rectangle rec,int lineThick,Color color)

{
  Rectangle rec_00;
  Rectangle rec_01;
  Rectangle rec_02;
  Rectangle rec_03;
  undefined1 auVar1 [12];
  float fVar2;
  Rectangle right;
  Rectangle left;
  Rectangle bottom;
  Rectangle top;
  float thick;
  int lineThick_local;
  Color color_local;
  Rectangle rec_local;
  
  rec_local.x = rec.width;
  rec_local.y = rec.height;
  top.height = (float)lineThick;
  if ((rec_local.x < (float)lineThick) || (rec_local.y < (float)lineThick)) {
    if (rec_local.x <= rec_local.y) {
      if (rec_local.x < rec_local.y) {
        top.height = (float)((int)rec_local.x / 2);
      }
    }
    else {
      top.height = (float)((int)rec_local.y / 2);
    }
  }
  fVar2 = (float)(int)top.height;
  lineThick_local = (int)rec.x;
  color_local = (Color)rec.y;
  auVar1 = rec._0_12_;
  rec_03.height = fVar2;
  rec_03.x = (float)auVar1._0_4_;
  rec_03.y = (float)auVar1._4_4_;
  rec_03.width = (float)auVar1._8_4_;
  DrawRectangleRec(rec_03,color);
  rec_02.y = ((float)color_local - fVar2) + rec_local.y;
  rec_02.x = (float)lineThick_local;
  rec_02.width = rec_local.x;
  rec_02.height = fVar2;
  DrawRectangleRec(rec_02,color);
  rec_01.y = (float)color_local + fVar2;
  rec_01.x = (float)lineThick_local;
  rec_01.width = fVar2;
  rec_01.height = rec_local.y - (fVar2 + fVar2);
  DrawRectangleRec(rec_01,color);
  rec_00.y = (float)color_local + fVar2;
  rec_00.x = ((float)lineThick_local - fVar2) + rec_local.x;
  rec_00.width = fVar2;
  rec_00.height = rec_local.y - (fVar2 + fVar2);
  DrawRectangleRec(rec_00,color);
  return;
}

Assistant:

void DrawRectangleLinesEx(Rectangle rec, int lineThick, Color color)
{
    if ((lineThick > rec.width) || (lineThick > rec.height))
    {
        if (rec.width > rec.height) lineThick = (int)rec.height/2;
        else if (rec.width < rec.height) lineThick = (int)rec.width/2;
    }

    // When rec = { x, y, 8.0f, 6.0f } and lineThick = 2, the following
    // four rectangles are drawn ([T]op, [B]ottom, [L]eft, [R]ight):
    //
    //   TTTTTTTT
    //   TTTTTTTT
    //   LL    RR
    //   LL    RR
    //   BBBBBBBB
    //   BBBBBBBB
    //
    float thick = (float)lineThick;
    Rectangle top = { rec.x, rec.y, rec.width, thick };
    Rectangle bottom = { rec.x, rec.y - thick + rec.height, rec.width, thick };
    Rectangle left = { rec.x, rec.y + thick, thick, rec.height - thick*2.0f };
    Rectangle right = { rec.x - thick + rec.width, rec.y + thick, thick, rec.height - thick*2.0f };

    DrawRectangleRec(top, color);
    DrawRectangleRec(bottom, color);
    DrawRectangleRec(left, color);
    DrawRectangleRec(right, color);
}